

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

void llama_sampler_grammar_free(llama_sampler *smpl)

{
  void *pvVar1;
  
  pvVar1 = smpl->ctx;
  if (*(llama_grammar **)((long)pvVar1 + 0x48) != (llama_grammar *)0x0) {
    llama_grammar_free_impl(*(llama_grammar **)((long)pvVar1 + 0x48));
  }
  if (*(long **)((long)pvVar1 + 0x28) != (long *)((long)pvVar1 + 0x38)) {
    operator_delete(*(long **)((long)pvVar1 + 0x28),*(long *)((long)pvVar1 + 0x38) + 1);
  }
  if (*(long **)((long)pvVar1 + 8) != (long *)((long)pvVar1 + 0x18)) {
    operator_delete(*(long **)((long)pvVar1 + 8),*(long *)((long)pvVar1 + 0x18) + 1);
  }
  operator_delete(pvVar1,0x50);
  return;
}

Assistant:

static void llama_sampler_grammar_free(struct llama_sampler * smpl) {
    const auto * ctx = (llama_sampler_grammar *) smpl->ctx;

    if (ctx->grammar) {
        llama_grammar_free_impl(ctx->grammar);
    }

    delete ctx;
}